

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O0

void phits_set_stdout(FILE *fh)

{
  FILE **ppFVar1;
  FILE *in_RDI;
  FILE **fhptr;
  
  fflush(_stdout);
  fflush(_stderr);
  ppFVar1 = phits_impl_stdout_data();
  if (*ppFVar1 != (FILE *)0x0) {
    fflush((FILE *)*ppFVar1);
  }
  if (in_RDI != (FILE *)0x0) {
    fflush(in_RDI);
  }
  *ppFVar1 = (FILE *)in_RDI;
  return;
}

Assistant:

void phits_set_stdout( FILE* fh )
{
  fflush(stdout);
  fflush(stderr);
  FILE** fhptr = phits_impl_stdout_data();
  if (*fhptr)
    fflush(*fhptr);
  if (fh)
    fflush(fh);
  *fhptr = fh;
}